

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O3

void jsons_print_imports(lyout *out,lys_module *mod,int *first)

{
  byte bVar1;
  char *pcVar2;
  lys_module *plVar3;
  int iVar4;
  lys_revision *plVar5;
  lys_revision *plVar6;
  lys_import *plVar7;
  ulong uVar8;
  lys_revision *plVar9;
  char *local_50;
  lyout *local_48;
  char *local_40;
  char *str;
  int f;
  
  if ((mod->imp_size != '\0') || (mod->inc_size != '\0')) {
    iVar4 = asprintf(&local_40,"%s\"import\":{",",");
    if (iVar4 == -1) {
      ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","jsons_print_imports");
    }
    else {
      bVar1 = mod->imp_size;
      if ((ulong)bVar1 != 0) {
        plVar7 = mod->imp;
        if (local_40 == (char *)0x0) {
          str._0_4_ = 1;
        }
        else {
          str._0_4_ = 0;
          ly_print(out,local_40);
          free(local_40);
          local_40 = (char *)0x0;
        }
        plVar9 = (lys_revision *)0x1a29e4;
        uVar8 = 0;
        local_48 = out;
        do {
          plVar5 = (lys_revision *)0x1a1fbd;
          if ((int)str == 0 && (int)uVar8 == 0) {
            plVar5 = plVar9;
          }
          plVar6 = (lys_revision *)"@";
          if (plVar7->rev[0] == '\0') {
            plVar6 = plVar9;
          }
          ly_print(out,"%s\"%s%s%s\":{",plVar5,plVar7->module->name,plVar6,plVar7->rev);
          str._4_4_ = 1;
          pcVar2 = plVar7->prefix;
          if (pcVar2 != (char *)0x0) {
            ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s","","prefix","value",pcVar2,"}");
          }
          str._4_4_ = (uint)(pcVar2 == (char *)0x0);
          jsons_print_text(out,"description","text",plVar7->dsc,1,(int *)((long)&str + 4));
          jsons_print_text(out,"reference","text",plVar7->ref,1,(int *)((long)&str + 4));
          plVar3 = plVar7->module;
          plVar6 = plVar9;
          plVar5 = plVar9;
          if (plVar3->rev_size != '\0') {
            plVar6 = plVar3->rev;
            plVar5 = (lys_revision *)"@";
          }
          iVar4 = asprintf(&local_50,"%s%s%s",plVar3->name,plVar5,plVar6);
          out = local_48;
          if (iVar4 == -1) {
            ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "jsons_print_imports_");
            out = local_48;
            break;
          }
          jsons_print_text(local_48,"resolves-to","module",local_50,1,(int *)((long)&str + 4));
          free(local_50);
          ly_print(out,"}");
          uVar8 = uVar8 + 1;
          plVar7 = plVar7 + 1;
        } while (bVar1 != uVar8);
      }
      if (local_40 == (char *)0x0) {
        ly_print(out,"}");
      }
      else {
        free(local_40);
      }
    }
  }
  return;
}

Assistant:

static void
jsons_print_imports(struct lyout *out, const struct lys_module *mod, int *first)
{
    char *str;

    if (!mod->imp_size && !mod->inc_size) {
        return;
    }

    if (asprintf(&str, "%s\"import\":{", (first && (*first)) ? "" : ",") == -1) {
        LOGMEM(mod->ctx);
        return;
    }
    jsons_print_imports_(out, NULL, mod->imp, mod->imp_size, &str);
    /* FIXME key duplication in case multiple submodules imports the same module,
     * but the question is if it is needed to print imports even from submodules -
     * similar code should be then added even for typedefs or identities
    for (i = 0; i < mod->inc_size; ++i) {
        jsons_print_imports_(out, mod->inc[i].submodule, mod->inc[i].submodule->imp, mod->inc[i].submodule->imp_size, &str);
    }
    */
    if (str) {
        free(str);
    } else {
        ly_print(out, "}");
    }
    if (first) {
        (*first) = 0;
    }
}